

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_15ef52::ReverbState::MixOutAmbiUp
          (ReverbState *this,span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut,
          size_t counter,size_t offset,size_t todo)

{
  span<const_float,_18446744073709551615UL> Gains;
  span<const_float,_18446744073709551615UL> Gains_00;
  span<float,_18446744073709551615UL> OutBuffer;
  span<float,_18446744073709551615UL> OutBuffer_00;
  span<std::array<float,_1024UL>,_18446744073709551615UL> sVar1;
  span<float,_18446744073709551615UL> samples;
  span<float,_18446744073709551615UL> samples_00;
  span<const_float,_18446744073709551615UL> sVar2;
  MixerFunc p_Var3;
  pointer ptr;
  float *ptr_00;
  reference pvVar4;
  reference pvVar5;
  size_type in_RCX;
  pointer in_RDX;
  BandSplitterR<float> *in_RSI;
  long in_RDI;
  array<std::array<float,_256UL>,_4UL> *in_R8;
  index_type in_R9;
  float hfscale_1;
  size_t c_1;
  float hfscale;
  size_t c;
  span<float,_18446744073709551615UL> tmpspan;
  size_type in_stack_fffffffffffffeb8;
  array<std::array<float,_256UL>,_4UL> *in_stack_fffffffffffffec0;
  span<float,_18446744073709551615UL> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  value_type_conflict in_stack_fffffffffffffed4;
  pointer in_stack_ffffffffffffff08;
  float *in_stack_ffffffffffffff10;
  pointer in_stack_ffffffffffffff18;
  pointer in_stack_ffffffffffffff20;
  pointer in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  value_type_conflict in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff58;
  ulong uVar6;
  BandSplitterR<float> *in_stack_ffffffffffffff60;
  pointer in_stack_ffffffffffffff68;
  pointer in_stack_ffffffffffffff70;
  pointer local_88;
  ulong local_48;
  span<float,_18446744073709551615UL> local_40;
  index_type local_30;
  array<std::array<float,_256UL>,_4UL> *local_28;
  size_type local_20;
  BandSplitterR<float> *local_10;
  pointer local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDX;
  ptr = std::array<float,_1024UL>::data((array<float,_1024UL> *)0x1e25b0);
  ptr_00 = al::assume_aligned<16ul,float>(ptr);
  al::span<float,_18446744073709551615UL>::span(&local_40,ptr_00,local_30);
  for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
    al::span<float_const,18446744073709551615ul>::span<4ul>
              ((span<const_float,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (element_type (*) [4])in_stack_fffffffffffffec8);
    std::array<std::array<float,_256UL>,_4UL>::operator[]
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::array<float,_256UL>::data((array<float,_256UL> *)0x1e264b);
    pvVar4 = std::array<std::array<float,_256UL>,_4UL>::operator[]
                       (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::array<float,_256UL>::size(pvVar4);
    OutBuffer.mDataEnd._0_4_ = in_stack_ffffffffffffff30;
    OutBuffer.mData = in_stack_ffffffffffffff28;
    OutBuffer.mDataEnd._4_4_ = in_stack_ffffffffffffff34;
    Gains.mDataEnd = in_stack_ffffffffffffff20;
    Gains.mData = in_stack_ffffffffffffff18;
    DoMixRow(OutBuffer,Gains,in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    if (local_48 == 0) {
      std::array<float,_4UL>::operator[]
                ((array<float,_4UL> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    else {
      std::array<float,_4UL>::operator[]
                ((array<float,_4UL> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    std::array<std::array<BandSplitterR<float>,_4UL>,_2UL>::operator[]
              ((array<std::array<BandSplitterR<float>,_4UL>,_2UL> *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
    std::array<BandSplitterR<float>,_4UL>::operator[]
              ((array<BandSplitterR<float>,_4UL> *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
    samples.mDataEnd = in_stack_ffffffffffffff70;
    samples.mData = in_stack_ffffffffffffff68->_M_elems;
    BandSplitterR<float>::processHfScale
              (in_stack_ffffffffffffff60,samples,(float)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    p_Var3 = MixSamples;
    al::span<const_float,_18446744073709551615UL>::span<float,_18446744073709551615UL,_true,_true>
              ((span<const_float,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    sVar2.mDataEnd = local_88;
    sVar2.mData = in_stack_ffffffffffffff70;
    sVar1.mDataEnd = local_8;
    sVar1.mData = (pointer)local_10;
    in_stack_fffffffffffffeb8 = local_20;
    in_stack_fffffffffffffec0 = local_28;
    in_stack_ffffffffffffff60 = local_10;
    in_stack_ffffffffffffff68 = local_8;
    (*p_Var3)(sVar2,sVar1,(float *)(in_RDI + 0x2c8 + local_48 * 0x40),
              (float *)(in_RDI + 0x3c8 + local_48 * 0x40),local_20,(size_t)local_28);
  }
  for (uVar6 = 0; uVar6 < 4; uVar6 = uVar6 + 1) {
    al::span<float_const,18446744073709551615ul>::span<4ul>
              ((span<const_float,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (element_type (*) [4])in_stack_fffffffffffffec8);
    std::array<std::array<float,_256UL>,_4UL>::operator[]
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::array<float,_256UL>::data((array<float,_256UL> *)0x1e28b5);
    pvVar4 = std::array<std::array<float,_256UL>,_4UL>::operator[]
                       (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::array<float,_256UL>::size(pvVar4);
    OutBuffer_00.mDataEnd._0_4_ = in_stack_ffffffffffffff30;
    OutBuffer_00.mData = in_stack_ffffffffffffff28;
    OutBuffer_00.mDataEnd._4_4_ = in_stack_ffffffffffffff34;
    Gains_00.mDataEnd = in_stack_ffffffffffffff20;
    Gains_00.mData = in_stack_ffffffffffffff18;
    DoMixRow(OutBuffer_00,Gains_00,in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    if (uVar6 == 0) {
      pvVar5 = std::array<float,_4UL>::operator[]
                         ((array<float,_4UL> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffed4 = *pvVar5;
    }
    else {
      pvVar5 = std::array<float,_4UL>::operator[]
                         ((array<float,_4UL> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffed4 = *pvVar5;
    }
    in_stack_ffffffffffffff34 = in_stack_fffffffffffffed4;
    std::array<std::array<BandSplitterR<float>,_4UL>,_2UL>::operator[]
              ((array<std::array<BandSplitterR<float>,_4UL>,_2UL> *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
    std::array<BandSplitterR<float>,_4UL>::operator[]
              ((array<BandSplitterR<float>,_4UL> *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
    samples_00.mDataEnd = in_stack_ffffffffffffff70;
    samples_00.mData = in_stack_ffffffffffffff68->_M_elems;
    in_stack_ffffffffffffff20 = local_40.mData;
    in_stack_ffffffffffffff28 = local_40.mDataEnd;
    BandSplitterR<float>::processHfScale
              (in_stack_ffffffffffffff60,samples_00,(float)(uVar6 >> 0x20));
    in_stack_fffffffffffffec8 = (span<float,_18446744073709551615UL> *)MixSamples;
    al::span<const_float,_18446744073709551615UL>::span<float,_18446744073709551615UL,_true,_true>
              ((span<const_float,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (span<float,_18446744073709551615UL> *)MixSamples);
    in_stack_fffffffffffffeb8 = local_20;
    in_stack_fffffffffffffec0 = local_28;
    in_stack_ffffffffffffff08 = local_8;
    (*(code *)in_stack_fffffffffffffec8)
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,local_10,local_8,
               in_RDI + 0xa88 + uVar6 * 0x40,in_RDI + 0xb88 + uVar6 * 0x40);
  }
  return;
}

Assistant:

void MixOutAmbiUp(const al::span<FloatBufferLine> samplesOut, const size_t counter,
        const size_t offset, const size_t todo)
    {
        ASSUME(todo > 0);

        const al::span<float> tmpspan{al::assume_aligned<16>(mTempLine.data()), todo};
        for(size_t c{0u};c < NUM_LINES;c++)
        {
            DoMixRow(tmpspan, A2B[c], mEarlySamples[0].data(), mEarlySamples[0].size());

            /* Apply scaling to the B-Format's HF response to "upsample" it to
             * higher-order output.
             */
            const float hfscale{(c==0) ? mOrderScales[0] : mOrderScales[1]};
            mAmbiSplitter[0][c].processHfScale(tmpspan, hfscale);

            MixSamples(tmpspan, samplesOut, mEarly.CurrentGain[c], mEarly.PanGain[c], counter,
                offset);
        }
        for(size_t c{0u};c < NUM_LINES;c++)
        {
            DoMixRow(tmpspan, A2B[c], mLateSamples[0].data(), mLateSamples[0].size());

            const float hfscale{(c==0) ? mOrderScales[0] : mOrderScales[1]};
            mAmbiSplitter[1][c].processHfScale(tmpspan, hfscale);

            MixSamples(tmpspan, samplesOut, mLate.CurrentGain[c], mLate.PanGain[c], counter,
                offset);
        }
    }